

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu1_v2.c
# Opt level: O2

MPP_RET hal_jpege_vepu1_wait(void *hal,HalEncTask *task)

{
  uint uVar1;
  uint uVar2;
  JpegeBits ctx;
  long lVar3;
  MPP_RET MVar4;
  uint uVar5;
  uint uVar6;
  MPP_RET MVar7;
  
  ctx = *(JpegeBits *)((long)hal + 0x10);
  lVar3 = *(long *)((long)hal + 0x18);
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu1","enter hal %p\n","hal_jpege_vepu1_wait",hal);
  }
  MVar7 = MPP_OK;
  if (*hal != (MppDev)0x0) {
    MVar4 = mpp_dev_ioctl(*hal,0x10,(void *)0x0);
    MVar7 = MPP_OK;
    if (MVar4 != MPP_OK) {
      _mpp_log_l(2,"hal_jpege_vepu1","poll cmd failed %d\n","hal_jpege_vepu1_wait",
                 (ulong)(uint)MVar4);
      MVar7 = MVar4;
    }
  }
  uVar1 = *(uint *)(lVar3 + 4);
  if ((hal_jpege_debug & 0x20) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu1","hw_status %08x\n",(char *)0x0,(ulong)uVar1);
  }
  *(uint *)((long)hal + 0xf8) = uVar1 & 0x70;
  uVar2 = *(uint *)(lVar3 + 0x60);
  uVar5 = jpege_bits_get_bitpos(ctx);
  uVar1 = (uVar2 >> 3) + (uVar5 >> 6) * 8;
  *(uint *)((long)hal + 0xfc) = uVar1;
  task->length = uVar1;
  uVar6 = uVar1 - *(int *)((long)hal + 0x150);
  task->hw_length = uVar6;
  if ((hal_jpege_debug & 0x20) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu1","stream bit: sw %d hw %d total %d hw_length %d\n",(char *)0x0,
               (ulong)uVar5,(ulong)uVar2,(ulong)uVar1,(ulong)uVar6);
  }
  if ((hal_jpege_debug & 1) != 0) {
    _mpp_log_l(4,"hal_jpege_vepu1","leave hal %p\n","hal_jpege_vepu1_wait",hal);
  }
  return MVar7;
}

Assistant:

static MPP_RET hal_jpege_vepu1_wait(void *hal, HalEncTask *task)
{
    MPP_RET ret = MPP_OK;
    HalJpegeCtx *ctx = (HalJpegeCtx *)hal;
    JpegeBits bits = ctx->bits;
    RK_U32 *regs = (RK_U32 *)ctx->regs;
    JpegeFeedback *feedback = &ctx->feedback;
    RK_U32 val;
    RK_U32 sw_bit = 0;
    RK_U32 hw_bit = 0;

    hal_jpege_dbg_func("enter hal %p\n", hal);

    if (ctx->dev) {
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
        if (ret)
            mpp_err_f("poll cmd failed %d\n", ret);
    }

    val = regs[1];
    hal_jpege_dbg_output("hw_status %08x\n", val);
    feedback->hw_status = val & 0x70;
    val = regs[24];

    sw_bit = jpege_bits_get_bitpos(bits);
    hw_bit = val;

    // NOTE: hardware will return 64 bit access byte count
    feedback->stream_length = ((sw_bit / 8) & (~0x7)) + hw_bit / 8;
    task->length = feedback->stream_length;
    task->hw_length = task->length - ctx->hal_start_pos;
    hal_jpege_dbg_output("stream bit: sw %d hw %d total %d hw_length %d\n",
                         sw_bit, hw_bit, feedback->stream_length, task->hw_length);

    hal_jpege_dbg_func("leave hal %p\n", hal);
    return ret;
}